

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void duckdb::ListCombineFunction
               (Vector *states_vector,Vector *combined,AggregateInputData *aggr_input_data,
               idx_t count)

{
  LogicalType *pLVar1;
  RecursiveUnifiedVectorFormat *pRVar2;
  ListSegmentFunctions *this;
  ArenaAllocator *allocator;
  RecursiveUnifiedVectorFormat *this_00;
  RecursiveUnifiedVectorFormat *input_data_00;
  idx_t iVar3;
  ulong in_RCX;
  long in_RDX;
  idx_t entry_idx;
  RecursiveUnifiedVectorFormat input_data;
  Vector input;
  idx_t entry_count;
  ListAggState *target;
  ListAggState *source;
  idx_t i;
  LogicalType result_type;
  ListBindData *list_bind_data;
  ListAggState **combined_ptr;
  ListAggState **states_ptr;
  UnifiedVectorFormat states_data;
  LogicalType *in_stack_fffffffffffffdf8;
  RecursiveUnifiedVectorFormat *in_stack_fffffffffffffe00;
  UnifiedVectorFormat *in_stack_fffffffffffffe10;
  UnifiedVectorFormat *capacity;
  LogicalType *in_stack_fffffffffffffe38;
  Vector *in_stack_fffffffffffffe40;
  RecursiveUnifiedVectorFormat *in_stack_fffffffffffffe70;
  idx_t in_stack_fffffffffffffe78;
  Vector *in_stack_fffffffffffffe80;
  idx_t in_stack_fffffffffffffe88;
  AggregateInputData *in_stack_fffffffffffffe90;
  Vector *in_stack_fffffffffffffe98;
  Vector *in_stack_fffffffffffffea0;
  UnifiedVectorFormat *in_stack_fffffffffffffec0;
  idx_t in_stack_fffffffffffffec8;
  Vector *in_stack_fffffffffffffed0;
  ulong local_b0;
  UnifiedVectorFormat local_68;
  ulong local_20;
  
  if (*(char *)(in_RDX + 0x10) == '\x02') {
    ListAbsorbFunction(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90
                       ,in_stack_fffffffffffffe88);
  }
  else {
    capacity = &local_68;
    local_20 = in_RCX;
    UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffe10);
    Vector::ToUnifiedFormat
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    pRVar2 = (RecursiveUnifiedVectorFormat *)
             UnifiedVectorFormat::GetData<duckdb::ListAggState_const*>(&local_68);
    this = (ListSegmentFunctions *)FlatVector::GetData<duckdb::ListAggState*>((Vector *)0x1e2ff9b);
    allocator = (ArenaAllocator *)
                optional_ptr<duckdb::FunctionData,_true>::operator->
                          ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_fffffffffffffe00);
    this_00 = (RecursiveUnifiedVectorFormat *)
              FunctionData::Cast<duckdb::ListBindData>((FunctionData *)in_stack_fffffffffffffe00);
    input_data_00 =
         (RecursiveUnifiedVectorFormat *)
         ListType::GetChildType((LogicalType *)in_stack_fffffffffffffe00);
    LogicalType::LogicalType((LogicalType *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    for (local_b0 = 0; local_b0 < local_20; local_b0 = local_b0 + 1) {
      in_stack_fffffffffffffe00 = pRVar2;
      iVar3 = SelectionVector::get_index(local_68.sel,local_b0);
      pLVar1 = (LogicalType *)(&(in_stack_fffffffffffffe00->unified).sel)[iVar3]->sel_vector;
      LogicalType::LogicalType((LogicalType *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      Vector::Vector(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,(idx_t)capacity);
      LogicalType::~LogicalType((LogicalType *)0x1e300da);
      ListSegmentFunctions::BuildListVector
                (this,(LinkedList *)allocator,(Vector *)this_00,(idx_t)input_data_00);
      RecursiveUnifiedVectorFormat::RecursiveUnifiedVectorFormat(this_00);
      Vector::RecursiveToUnifiedFormat
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      for (in_stack_fffffffffffffe38 = (LogicalType *)0x0; in_stack_fffffffffffffe38 < pLVar1;
          in_stack_fffffffffffffe38 = (LogicalType *)&in_stack_fffffffffffffe38->physical_type_) {
        ArenaAllocator::AlignNext((ArenaAllocator *)in_stack_fffffffffffffe00);
        ListSegmentFunctions::AppendRow
                  (this,allocator,(LinkedList *)this_00,input_data_00,
                   (idx_t *)in_stack_fffffffffffffe00);
      }
      RecursiveUnifiedVectorFormat::~RecursiveUnifiedVectorFormat(in_stack_fffffffffffffe00);
      Vector::~Vector((Vector *)in_stack_fffffffffffffe00);
    }
    LogicalType::~LogicalType((LogicalType *)0x1e30275);
    UnifiedVectorFormat::~UnifiedVectorFormat(&in_stack_fffffffffffffe00->unified);
  }
  return;
}

Assistant:

static void ListCombineFunction(Vector &states_vector, Vector &combined, AggregateInputData &aggr_input_data,
                                idx_t count) {

	//	Can we use destructive combining?
	if (aggr_input_data.combine_type == AggregateCombineType::ALLOW_DESTRUCTIVE) {
		ListAbsorbFunction(states_vector, combined, aggr_input_data, count);
		return;
	}

	UnifiedVectorFormat states_data;
	states_vector.ToUnifiedFormat(count, states_data);
	auto states_ptr = UnifiedVectorFormat::GetData<const ListAggState *>(states_data);
	auto combined_ptr = FlatVector::GetData<ListAggState *>(combined);

	auto &list_bind_data = aggr_input_data.bind_data->Cast<ListBindData>();
	auto result_type = ListType::GetChildType(list_bind_data.stype);

	for (idx_t i = 0; i < count; i++) {
		auto &source = *states_ptr[states_data.sel->get_index(i)];
		auto &target = *combined_ptr[i];

		const auto entry_count = source.linked_list.total_capacity;
		Vector input(result_type, source.linked_list.total_capacity);
		list_bind_data.functions.BuildListVector(source.linked_list, input, 0);

		RecursiveUnifiedVectorFormat input_data;
		Vector::RecursiveToUnifiedFormat(input, entry_count, input_data);

		for (idx_t entry_idx = 0; entry_idx < entry_count; ++entry_idx) {
			aggr_input_data.allocator.AlignNext();
			list_bind_data.functions.AppendRow(aggr_input_data.allocator, target.linked_list, input_data, entry_idx);
		}
	}
}